

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::select::render_input(select *this,form_context *context)

{
  widget_part_type wVar1;
  uint uVar2;
  html_type hVar3;
  escape *peVar4;
  ulong uVar5;
  size_type sVar6;
  string *s;
  ostream *poVar7;
  base_widget *in_RSI;
  select_base *in_RDI;
  element *el;
  uint i;
  ostream *out;
  escape *in_stack_fffffffffffffee8;
  escape *in_stack_fffffffffffffef0;
  escape *this_00;
  streamable *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff10;
  uint uVar8;
  form_context *in_stack_ffffffffffffff30;
  streamable local_c0;
  undefined1 local_a0 [132];
  uint local_1c;
  form_context *in_stack_ffffffffffffffe8;
  
  base_widget::auto_generate(in_RSI,in_stack_ffffffffffffffe8);
  peVar4 = (escape *)form_context::out(in_stack_ffffffffffffff30);
  wVar1 = form_context::widget_part((form_context *)in_RSI);
  if (wVar1 == first_part) {
    std::operator<<((ostream *)peVar4,"<select ");
    (*(in_RDI->super_base_widget).super_base_form._vptr_base_form[9])(in_RDI,in_RSI);
  }
  else {
    std::operator<<((ostream *)peVar4," >\n");
    local_1c = 0;
    while( true ) {
      uVar5 = (ulong)local_1c;
      sVar6 = std::
              vector<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
              ::size(&in_RDI->elements_);
      if (sVar6 <= uVar5) break;
      local_a0._120_8_ =
           std::
           vector<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
           ::operator[](&in_RDI->elements_,(ulong)local_1c);
      s = (string *)std::operator<<((ostream *)peVar4,"<option value=\"");
      util::escape(s);
      poVar7 = std::operator<<((ostream *)s,(string *)(local_a0 + 0x58));
      std::operator<<(poVar7,"\" ");
      std::__cxx11::string::~string((string *)(local_a0 + 0x58));
      uVar8 = local_1c;
      uVar2 = select_base::selected(in_RDI);
      this_00 = in_stack_fffffffffffffef0;
      if (uVar8 == uVar2) {
        hVar3 = form_context::html((form_context *)in_RSI);
        if (hVar3 == as_xhtml) {
          std::operator<<((ostream *)peVar4,"selected=\"selected\" ");
          this_00 = in_stack_fffffffffffffef0;
        }
        else {
          std::operator<<((ostream *)peVar4,"selected ");
          this_00 = in_stack_fffffffffffffef0;
        }
      }
      in_stack_fffffffffffffef0 = peVar4;
      std::operator<<((ostream *)in_stack_fffffffffffffef0,">");
      peVar4 = in_stack_fffffffffffffef0;
      if ((*(uint *)local_a0._120_8_ & 1) == 0) {
        in_stack_fffffffffffffef8 = &local_c0;
        util::escape(s);
        std::operator<<((ostream *)in_stack_fffffffffffffef0,(string *)in_stack_fffffffffffffef8);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      else {
        filters::streamable::streamable<booster::locale::basic_message<char>>
                  ((streamable *)CONCAT44(uVar8,in_stack_ffffffffffffff10),
                   (basic_message<char> *)local_a0);
        filters::escape::escape(in_stack_fffffffffffffef0,in_stack_fffffffffffffef8);
        filters::operator<<((ostream *)this_00,in_stack_fffffffffffffee8);
        filters::escape::~escape(this_00);
        filters::streamable::~streamable((streamable *)local_a0);
        in_stack_fffffffffffffef0 = this_00;
      }
      std::operator<<((ostream *)peVar4,"</option>\n");
      local_1c = local_1c + 1;
    }
    std::operator<<((ostream *)peVar4,"</select>");
  }
  return;
}

Assistant:

void select::render_input(form_context &context)
{
	auto_generate(&context);
	std::ostream &out=context.out();
	if(context.widget_part() == first_part) {
		out<<"<select ";
		render_attributes(context);
	}
	else {
		out<<" >\n";
		for(unsigned i=0;i<elements_.size();i++) {
			element &el=elements_[i];
			out << "<option value=\"" << util::escape(el.id) <<"\" ";
			if(int(i) == selected()) {
				if(context.html() == as_xhtml)
					out << "selected=\"selected\" ";
				else
					out << "selected ";
			}
			out << ">";
			if(el.need_translation)
				out << filters::escape(el.tr_option);
			else
				out << util::escape(el.str_option);
			out << "</option>\n";
		}
		out << "</select>";
	}
}